

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SysInfo.cpp
# Opt level: O3

BOOL __thiscall AutoSystemInfo::GetAvailableCommit(AutoSystemInfo *this,ULONG64 *pCommit)

{
  ULONG64 UVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if (this->initialized == false) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/SysInfo.cpp"
                       ,0x1b8,"(initialized)","initialized");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  UVar1 = this->availableCommit;
  if (UVar1 != 0) {
    *pCommit = UVar1;
  }
  return (uint)(UVar1 != 0);
}

Assistant:

BOOL AutoSystemInfo::GetAvailableCommit(ULONG64 *pCommit)
{
    Assert(initialized);

    // Non-zero value indicates we've been here before.
    if (this->availableCommit == 0)
    {
        return false;
    }

    *pCommit = this->availableCommit;
    return true;
}